

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_swap(DisasContext_conflict14 *ctx,int reg,TCGv_i32 ea)

{
  TCGContext_conflict9 *tcg_ctx;
  TCGv_i32 val;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  val = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_qemu_ld_i32_tricore(tcg_ctx,val,ea,(long)ctx->mem_idx,MO_32);
  tcg_gen_qemu_st_i32_tricore(tcg_ctx,tcg_ctx->cpu_gpr_d[(uint)reg],ea,(long)ctx->mem_idx,MO_32);
  tcg_gen_mov_i32(tcg_ctx,tcg_ctx->cpu_gpr_d[(uint)reg],val);
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(val + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_swap(DisasContext *ctx, int reg, TCGv ea)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv temp = tcg_temp_new(tcg_ctx);

    tcg_gen_qemu_ld_tl(tcg_ctx, temp, ea, ctx->mem_idx, MO_LEUL);
    tcg_gen_qemu_st_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[reg], ea, ctx->mem_idx, MO_LEUL);
    tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[reg], temp);

    tcg_temp_free(tcg_ctx, temp);
}